

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O3

bool __thiscall Rml::DataViewStyle::Update(DataViewStyle *this,DataModel *model)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  Element *element;
  Property *this_00;
  String *name;
  DataExpression *this_01;
  String value;
  Variant variant;
  DataExpressionInterface expr_interface;
  String local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Variant local_68;
  DataExpressionInterface local_40;
  
  Variant::Variant(&local_68);
  element = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface(&local_40,model,element,(Event *)0x0);
  if (element != (Element *)0x0) {
    this_01 = (this->super_DataViewCommon).expression._M_t.
              super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>.
              _M_t.
              super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
              .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl;
    if (this_01 == (DataExpression *)0x0) {
      bVar3 = Assert("RMLUI_ASSERT(expression)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                     ,0x4f);
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      this_01 = (this->super_DataViewCommon).expression._M_t.
                super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl;
    }
    bVar3 = DataExpression::Run(this_01,&local_40,&local_68);
    if (bVar3) {
      paVar1 = &local_a8.field_2;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_local_buf[0] = '\0';
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_68,&local_a8);
      name = &(this->super_DataViewCommon).modifier;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p == paVar1) {
        local_c8.field_2._8_8_ = local_a8.field_2._8_8_;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8._M_dataplus._M_p = local_a8._M_dataplus._M_p;
      }
      local_c8.field_2._M_allocated_capacity._1_7_ = local_a8.field_2._M_allocated_capacity._1_7_;
      local_c8.field_2._M_local_buf[0] = local_a8.field_2._M_local_buf[0];
      local_c8._M_string_length = local_a8._M_string_length;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_local_buf[0] = '\0';
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      this_00 = Element::GetLocalProperty(element,name);
      if (this_00 == (Property *)0x0) {
LAB_00203152:
        bVar3 = true;
        Element::SetProperty(element,name,&local_c8);
      }
      else {
        Property::Get<std::__cxx11::string>(&local_88,this_00);
        if (local_88._M_string_length == local_c8._M_string_length) {
          if (local_88._M_string_length == 0) {
            bVar3 = false;
          }
          else {
            iVar4 = bcmp(local_88._M_dataplus._M_p,local_c8._M_dataplus._M_p,
                         local_88._M_string_length);
            bVar3 = iVar4 != 0;
          }
        }
        else {
          bVar3 = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if (bVar3) goto LAB_00203152;
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0020317d;
    }
  }
  bVar3 = false;
LAB_0020317d:
  Variant::~Variant(&local_68);
  return bVar3;
}

Assistant:

bool DataViewStyle::Update(DataModel& model)
{
	const String& property_name = GetModifier();
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		const String value = variant.Get<String>();
		const Property* p = element->GetLocalProperty(property_name);
		if (!p || p->Get<String>() != value)
		{
			element->SetProperty(property_name, value);
			result = true;
		}
	}
	return result;
}